

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

optional<pbrt::ShapeSample> * __thiscall
pbrt::BilinearPatch::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,BilinearPatch *this,Point2f u)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  Tuple3<pbrt::Point3,_float> *t0;
  Tuple3<pbrt::Point3,_float> *t0_00;
  Tuple3<pbrt::Point3,_float> *t1;
  Tuple3<pbrt::Point3,_float> *t1_00;
  bool bVar7;
  undefined1 auVar8 [16];
  Point2f p;
  undefined1 auVar9 [16];
  undefined4 uVar38;
  undefined1 in_register_00001208 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar39 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined4 uVar40;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar43 [64];
  undefined1 auVar49 [60];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar48 [12];
  undefined1 auVar47 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  Point3<float> PVar55;
  Vector3<float> VVar56;
  initializer_list<float> v;
  span<const_float> w_00;
  span<const_float> w_01;
  Float pdf;
  undefined1 local_178 [16];
  float local_15c;
  undefined1 local_158 [16];
  Tuple3<pbrt::Vector3,_float> local_148;
  optional<pbrt::ShapeSample> *local_138;
  Point2f u_local;
  Tuple3<pbrt::Vector3,_float> local_128;
  Tuple3<pbrt::Vector3,_float> local_118;
  float local_108;
  float fStack_104;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  char *local_e8;
  Tuple3<pbrt::Vector3,_float> local_e0;
  Tuple3<pbrt::Vector3,_float> local_d0;
  Tuple3<pbrt::Vector3,_float> local_c0;
  Tuple3<pbrt::Vector3,_float> local_b0;
  Tuple3<pbrt::Vector3,_float> local_a0;
  Point3fi local_90;
  Tuple3<pbrt::Point3,_float> local_78;
  Tuple3<pbrt::Point3,_float> local_68;
  array<float,_4> w;
  undefined8 uStack_38;
  undefined1 extraout_var [56];
  
  auVar49 = in_ZMM1._4_60_;
  auVar10._8_56_ = in_register_00001208;
  auVar10._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_178 = auVar10._0_16_;
  u_local.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(local_178);
  local_e8 = *(char **)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar2 = *(long *)(local_e8 + 0x10);
  lVar6 = (long)this->blpIndex * 0x10;
  lVar3 = *(long *)(local_e8 + 0x18);
  pdf = 1.0;
  t0_00 = (Tuple3<pbrt::Point3,_float> *)((long)*(int *)(lVar2 + lVar6) * 0xc + lVar3);
  t0 = (Tuple3<pbrt::Point3,_float> *)((long)*(int *)(lVar2 + 4 + lVar6) * 0xc + lVar3);
  t1_00 = (Tuple3<pbrt::Point3,_float> *)((long)*(int *)(lVar2 + 8 + lVar6) * 0xc + lVar3);
  t1 = (Tuple3<pbrt::Point3,_float> *)((long)*(int *)(lVar2 + 0xc + lVar6) * 0xc + lVar3);
  local_138 = __return_storage_ptr__;
  if (*(PiecewiseConstant2D **)(local_e8 + 0x38) == (PiecewiseConstant2D *)0x0) {
    bVar7 = IsRectangle(this);
    auVar39 = ZEXT856(local_178._8_8_);
    if (!bVar7) {
      VVar56 = Point3<float>::operator-((Point3<float> *)t0,(Point3<float> *)t0_00);
      local_a0.z = VVar56.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar12._0_8_ = VVar56.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar12._8_56_ = auVar39;
      local_a0._0_8_ = vmovlps_avx(auVar12._0_16_);
      VVar56 = Point3<float>::operator-((Point3<float> *)t1_00,(Point3<float> *)t0_00);
      local_b0.z = VVar56.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar13._0_8_ = VVar56.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar13._8_56_ = auVar39;
      local_b0._0_8_ = vmovlps_avx(auVar13._0_16_);
      VVar56 = Cross<float>((Vector3<float> *)&local_a0,(Vector3<float> *)&local_b0);
      auVar43._0_4_ = VVar56.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar43._4_60_ = auVar49;
      auVar14._0_8_ = VVar56.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar14._8_56_ = auVar39;
      auVar8._0_4_ = VVar56.super_Tuple3<pbrt::Vector3,_float>.x *
                     VVar56.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar8._4_4_ = VVar56.super_Tuple3<pbrt::Vector3,_float>.y *
                     VVar56.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar8._8_4_ = auVar39._0_4_ * auVar39._0_4_;
      auVar8._12_4_ = auVar39._4_4_ * auVar39._4_4_;
      auVar8 = vmovshdup_avx(auVar8);
      auVar8 = vfmadd231ss_fma(auVar8,auVar14._0_16_,auVar14._0_16_);
      auVar8 = vfmadd231ss_fma(auVar8,auVar43._0_16_,auVar43._0_16_);
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      auVar39 = ZEXT856(auVar8._8_8_);
      local_90.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = auVar8._0_4_;
      VVar56 = Point3<float>::operator-((Point3<float> *)t0,(Point3<float> *)t0_00);
      auVar49 = auVar43._4_60_;
      local_118.z = VVar56.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar15._0_8_ = VVar56.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar15._8_56_ = auVar39;
      local_118._0_8_ = vmovlps_avx(auVar15._0_16_);
      VVar56 = Point3<float>::operator-((Point3<float> *)t1,(Point3<float> *)t0);
      local_128.z = VVar56.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar16._0_8_ = VVar56.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar16._8_56_ = auVar39;
      local_128._0_8_ = vmovlps_avx(auVar16._0_16_);
      VVar56 = Cross<float>((Vector3<float> *)&local_118,(Vector3<float> *)&local_128);
      auVar44._0_4_ = VVar56.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar44._4_60_ = auVar49;
      auVar17._0_8_ = VVar56.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar17._8_56_ = auVar39;
      auVar50._0_4_ =
           VVar56.super_Tuple3<pbrt::Vector3,_float>.x * VVar56.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar50._4_4_ =
           VVar56.super_Tuple3<pbrt::Vector3,_float>.y * VVar56.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar50._8_4_ = auVar39._0_4_ * auVar39._0_4_;
      auVar50._12_4_ = auVar39._4_4_ * auVar39._4_4_;
      auVar8 = vmovshdup_avx(auVar50);
      auVar8 = vfmadd231ss_fma(auVar8,auVar17._0_16_,auVar17._0_16_);
      auVar8 = vfmadd231ss_fma(auVar8,auVar44._0_16_,auVar44._0_16_);
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      auVar39 = ZEXT856(auVar8._8_8_);
      local_90.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = auVar8._0_4_;
      VVar56 = Point3<float>::operator-((Point3<float> *)t1_00,(Point3<float> *)t0_00);
      auVar49 = auVar44._4_60_;
      local_148.z = VVar56.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar18._0_8_ = VVar56.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar18._8_56_ = auVar39;
      local_148._0_8_ = vmovlps_avx(auVar18._0_16_);
      VVar56 = Point3<float>::operator-((Point3<float> *)t1,(Point3<float> *)t1_00);
      local_c0.z = VVar56.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar19._0_8_ = VVar56.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar19._8_56_ = auVar39;
      local_c0._0_8_ = vmovlps_avx(auVar19._0_16_);
      VVar56 = Cross<float>((Vector3<float> *)&local_148,(Vector3<float> *)&local_c0);
      auVar45._0_4_ = VVar56.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar45._4_60_ = auVar49;
      auVar20._0_8_ = VVar56.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar20._8_56_ = auVar39;
      auVar51._0_4_ =
           VVar56.super_Tuple3<pbrt::Vector3,_float>.x * VVar56.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar51._4_4_ =
           VVar56.super_Tuple3<pbrt::Vector3,_float>.y * VVar56.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar51._8_4_ = auVar39._0_4_ * auVar39._0_4_;
      auVar51._12_4_ = auVar39._4_4_ * auVar39._4_4_;
      auVar8 = vmovshdup_avx(auVar51);
      auVar8 = vfmadd231ss_fma(auVar8,auVar20._0_16_,auVar20._0_16_);
      auVar8 = vfmadd231ss_fma(auVar8,auVar45._0_16_,auVar45._0_16_);
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      auVar39 = ZEXT856(auVar8._8_8_);
      local_90.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = auVar8._0_4_;
      VVar56 = Point3<float>::operator-((Point3<float> *)t1,(Point3<float> *)t0);
      auVar49 = auVar45._4_60_;
      local_d0.z = VVar56.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar21._0_8_ = VVar56.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar21._8_56_ = auVar39;
      local_d0._0_8_ = vmovlps_avx(auVar21._0_16_);
      VVar56 = Point3<float>::operator-((Point3<float> *)t1,(Point3<float> *)t1_00);
      local_e0.z = VVar56.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar22._0_8_ = VVar56.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar22._8_56_ = auVar39;
      local_e0._0_8_ = vmovlps_avx(auVar22._0_16_);
      VVar56 = Cross<float>((Vector3<float> *)&local_d0,(Vector3<float> *)&local_e0);
      auVar46._0_4_ = VVar56.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar46._4_60_ = auVar49;
      auVar23._0_8_ = VVar56.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar23._8_56_ = auVar39;
      auVar52._0_4_ =
           VVar56.super_Tuple3<pbrt::Vector3,_float>.x * VVar56.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar52._4_4_ =
           VVar56.super_Tuple3<pbrt::Vector3,_float>.y * VVar56.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar52._8_4_ = auVar39._0_4_ * auVar39._0_4_;
      auVar52._12_4_ = auVar39._4_4_ * auVar39._4_4_;
      auVar8 = vmovshdup_avx(auVar52);
      auVar8 = vfmadd231ss_fma(auVar8,auVar23._0_16_,auVar23._0_16_);
      auVar8 = vfmadd231ss_fma(auVar8,auVar46._0_16_,auVar46._0_16_);
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      local_90.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = auVar8._0_4_;
      v._M_len = 4;
      v._M_array = (iterator)&local_90;
      pstd::array<float,_4>::array(&w,v);
      w_00.n = 4;
      w_00.ptr = w.values;
      p = SampleBilinear(u_local,w_00);
      local_178._8_8_ = extraout_XMM0_Qb;
      local_178._0_4_ = p.super_Tuple2<pbrt::Point2,_float>.x;
      local_178._4_4_ = p.super_Tuple2<pbrt::Point2,_float>.y;
      w_01.n = 4;
      w_01.ptr = w.values;
      pdf = BilinearPDF(p,w_01);
    }
  }
  else {
    auVar11._0_8_ =
         PiecewiseConstant2D::Sample(*(PiecewiseConstant2D **)(local_e8 + 0x38),&u_local,&pdf);
    auVar11._8_56_ = extraout_var;
    local_178 = auVar11._0_16_;
  }
  local_158 = vmovshdup_avx(local_178);
  auVar39 = ZEXT856(local_158._8_8_);
  PVar55 = Lerp<pbrt::Point3,float>(local_158._0_4_,t0_00,t1_00);
  local_a0.z = PVar55.super_Tuple3<pbrt::Point3,_float>.z;
  auVar24._0_8_ = PVar55.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar24._8_56_ = auVar39;
  local_a0._0_8_ = vmovlps_avx(auVar24._0_16_);
  auVar39 = ZEXT856((ulong)local_158._8_8_);
  PVar55 = Lerp<pbrt::Point3,float>(local_158._0_4_,t0,t1);
  local_b0.z = PVar55.super_Tuple3<pbrt::Point3,_float>.z;
  auVar25._0_8_ = PVar55.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar25._8_56_ = auVar39;
  local_b0._0_8_ = vmovlps_avx(auVar25._0_16_);
  auVar39 = ZEXT856((ulong)local_178._8_8_);
  PVar55 = Lerp<pbrt::Point3,float>
                     (local_178._0_4_,(Tuple3<pbrt::Point3,_float> *)&local_a0,
                      (Tuple3<pbrt::Point3,_float> *)&local_b0);
  local_118.z = PVar55.super_Tuple3<pbrt::Point3,_float>.z;
  auVar26._0_8_ = PVar55.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar26._8_56_ = auVar39;
  local_118._0_8_ = vmovlps_avx(auVar26._0_16_);
  auVar9._8_8_ = 0;
  auVar9._0_4_ = local_b0.x;
  auVar9._4_4_ = local_b0.y;
  auVar41._8_8_ = 0;
  auVar41._0_4_ = local_a0.x;
  auVar41._4_4_ = local_a0.y;
  local_f8 = vsubps_avx(auVar9,auVar41);
  local_128.z = local_b0.z - local_a0.z;
  local_128._0_8_ = vmovlps_avx(local_f8);
  local_158._0_4_ = local_128.z;
  uVar38 = local_178._8_4_;
  uVar40 = local_178._12_4_;
  PVar55 = Lerp<pbrt::Point3,float>((Float)local_178._0_4_,t1_00,t1);
  local_15c = PVar55.super_Tuple3<pbrt::Point3,_float>.z;
  local_108 = PVar55.super_Tuple3<pbrt::Point3,_float>.x;
  fStack_104 = PVar55.super_Tuple3<pbrt::Point3,_float>.y;
  local_f8._4_4_ = uVar40;
  local_f8._0_4_ = uVar38;
  auVar39 = ZEXT856((ulong)local_178._8_8_);
  PVar55 = Lerp<pbrt::Point3,float>(local_178._0_4_,t0_00,t0);
  auVar27._0_8_ = PVar55.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar27._8_56_ = auVar39;
  auVar5._4_4_ = fStack_104;
  auVar5._0_4_ = local_108;
  auVar5._8_8_ = uStack_100;
  auVar50 = vsubps_avx(auVar5,auVar27._0_16_);
  local_148._0_8_ = vmovlps_avx(auVar50);
  local_148.z = local_15c - PVar55.super_Tuple3<pbrt::Point3,_float>.z;
  auVar42._0_4_ = local_f8._0_4_ * local_f8._0_4_;
  auVar42._4_4_ = local_f8._4_4_ * local_f8._4_4_;
  auVar42._8_4_ = local_f8._8_4_ * local_f8._8_4_;
  auVar42._12_4_ = local_f8._12_4_ * local_f8._12_4_;
  auVar8 = vmovshdup_avx(auVar42);
  auVar8 = vfmadd231ss_fma(auVar8,local_f8,local_f8);
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_158._0_4_),ZEXT416((uint)local_158._0_4_));
  auVar48 = SUB6412(ZEXT864(0),4);
  if ((auVar8._0_4_ != 0.0) || (NAN(auVar8._0_4_))) {
    auVar54._0_4_ = auVar50._0_4_ * auVar50._0_4_;
    auVar54._4_4_ = auVar50._4_4_ * auVar50._4_4_;
    auVar54._8_4_ = auVar50._8_4_ * auVar50._8_4_;
    auVar54._12_4_ = auVar50._12_4_ * auVar50._12_4_;
    auVar8 = vmovshdup_avx(auVar54);
    auVar8 = vfmadd231ss_fma(auVar8,auVar50,auVar50);
    auVar8 = vfmadd213ss_fma(ZEXT416((uint)local_148.z),ZEXT416((uint)local_148.z),auVar8);
    auVar39 = ZEXT856(auVar8._8_8_);
    if ((auVar8._0_4_ != 0.0) || (NAN(auVar8._0_4_))) {
      VVar56 = Cross<float>((Vector3<float> *)&local_128,(Vector3<float> *)&local_148);
      w.values[2] = VVar56.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar28._0_8_ = VVar56.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar28._8_56_ = auVar39;
      w.values._0_8_ = vmovlps_avx(auVar28._0_16_);
      VVar56 = Normalize<float>((Vector3<float> *)&w);
      auVar29._0_8_ = VVar56.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar29._8_56_ = auVar39;
      bVar7 = *local_e8 == local_e8[1];
      if (!bVar7) {
        auVar29 = ZEXT1664(CONCAT412(auVar39._4_4_ ^ 0x80000000,
                                     CONCAT48(auVar39._0_4_ ^ 0x80000000,
                                              auVar29._0_8_ ^ 0x8000000080000000)));
      }
      auVar39 = auVar29._8_56_;
      local_158 = auVar29._0_16_;
      local_f8._0_8_ =
           CONCAT44(auVar48._0_4_,
                    (uint)bVar7 * (int)VVar56.super_Tuple3<pbrt::Vector3,_float>.z +
                    (uint)!bVar7 * (int)-VVar56.super_Tuple3<pbrt::Vector3,_float>.z) ^
           0x8000000000000000;
      local_f8._8_4_ = auVar48._4_4_ ^ 0x80000000;
      local_f8._12_4_ = auVar48._8_4_ ^ 0x80000000;
      PVar55 = Abs<pbrt::Point3,float>(t0_00);
      local_90.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low =
           PVar55.super_Tuple3<pbrt::Point3,_float>.z;
      auVar30._0_8_ = PVar55.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar30._8_56_ = auVar39;
      local_90.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
           (Interval<float>)vmovlps_avx(auVar30._0_16_);
      PVar55 = Abs<pbrt::Point3,float>(t0);
      local_d0.z = PVar55.super_Tuple3<pbrt::Point3,_float>.z;
      auVar31._0_8_ = PVar55.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar31._8_56_ = auVar39;
      local_d0._0_8_ = vmovlps_avx(auVar31._0_16_);
      PVar55 = Max<pbrt::Point3,float>
                         ((Tuple3<pbrt::Point3,_float> *)&local_90,
                          (Tuple3<pbrt::Point3,_float> *)&local_d0);
      auVar32._0_8_ = PVar55.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar32._8_56_ = auVar39;
      w.values._0_8_ = vmovlps_avx(auVar32._0_16_);
      w.values[2] = PVar55.super_Tuple3<pbrt::Point3,_float>.z;
      PVar55 = Abs<pbrt::Point3,float>(t1_00);
      local_68.z = PVar55.super_Tuple3<pbrt::Point3,_float>.z;
      auVar33._0_8_ = PVar55.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar33._8_56_ = auVar39;
      local_68._0_8_ = vmovlps_avx(auVar33._0_16_);
      PVar55 = Abs<pbrt::Point3,float>(t1);
      local_78.z = PVar55.super_Tuple3<pbrt::Point3,_float>.z;
      auVar34._0_8_ = PVar55.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar34._8_56_ = auVar39;
      local_78._0_8_ = vmovlps_avx(auVar34._0_16_);
      PVar55 = Max<pbrt::Point3,float>(&local_68,&local_78);
      local_e0.z = PVar55.super_Tuple3<pbrt::Point3,_float>.z;
      auVar35._0_8_ = PVar55.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar35._8_56_ = auVar39;
      local_e0._0_8_ = vmovlps_avx(auVar35._0_16_);
      PVar55 = Max<pbrt::Point3,float>
                         ((Tuple3<pbrt::Point3,_float> *)&w,(Tuple3<pbrt::Point3,_float> *)&local_e0
                         );
      auVar36._0_8_ = PVar55.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar36._8_56_ = auVar39;
      auVar4._8_4_ = 0x34800002;
      auVar4._0_8_ = 0x3480000234800002;
      auVar4._12_4_ = 0x34800002;
      auVar8 = vmulps_avx512vl(auVar36._0_16_,auVar4);
      local_c0.z = PVar55.super_Tuple3<pbrt::Point3,_float>.z * 2.3841864e-07;
      auVar49 = (undefined1  [60])0x0;
      local_c0._0_8_ = vmovlps_avx(auVar8);
      Point3fi::Point3fi(&local_90,(Point3f *)&local_118,(Vector3f *)&local_c0);
      w.values[3] = local_90.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      w.values[2] = local_90.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      w.values[0] = local_90.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
      w.values[1] = local_90.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar39 = (undefined1  [56])0x0;
      local_108 = pdf;
      VVar56 = Cross<float>((Vector3<float> *)&local_128,(Vector3<float> *)&local_148);
      auVar47._0_4_ = VVar56.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar47._4_60_ = auVar49;
      auVar37._0_8_ = VVar56.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar37._8_56_ = auVar39;
      auVar53._0_4_ =
           VVar56.super_Tuple3<pbrt::Vector3,_float>.x * VVar56.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar53._4_4_ =
           VVar56.super_Tuple3<pbrt::Vector3,_float>.y * VVar56.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar53._8_4_ = auVar39._0_4_ * auVar39._0_4_;
      auVar53._12_4_ = auVar39._4_4_ * auVar39._4_4_;
      uStack_38 = SUB168(ZEXT816(0),4);
      auVar8 = vmovshdup_avx(auVar53);
      auVar8 = vfmadd231ss_fma(auVar8,auVar37._0_16_,auVar37._0_16_);
      local_138->set = true;
      *(undefined8 *)((long)&local_138->optionalValue + 0x20) = uStack_38;
      auVar8 = vfmadd231ss_fma(auVar8,auVar47._0_16_,auVar47._0_16_);
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      (local_138->optionalValue).__align = (anon_struct_8_0_00000001_for___align)w.values._0_8_;
      *(undefined8 *)((long)&local_138->optionalValue + 8) = w.values._8_8_;
      *(Interval<float> *)((long)&local_138->optionalValue + 0x10) =
           local_90.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
      *(undefined8 *)((long)&local_138->optionalValue + 0x18) = 0;
      uVar1 = vmovlps_avx(local_158);
      *(undefined8 *)((long)&local_138->optionalValue + 0x28) = uVar1;
      *(undefined4 *)((long)&local_138->optionalValue + 0x30) = local_f8._0_4_;
      uVar1 = vmovlps_avx(local_178);
      *(undefined8 *)((long)&local_138->optionalValue + 0x34) = uVar1;
      *(undefined1 (*) [16])((long)&local_138->optionalValue + 0x40) = ZEXT816(0) << 0x20;
      *(float *)((long)&local_138->optionalValue + 0x50) = local_108 / auVar8._0_4_;
      return local_138;
    }
  }
  *(undefined8 *)((long)&local_138->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&local_138->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&local_138->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&local_138->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&local_138->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&local_138->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&local_138->optionalValue + 0x50) = 0;
  *(undefined8 *)&local_138->set = 0;
  (local_138->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&local_138->optionalValue + 8) = 0;
  *(undefined8 *)((long)&local_138->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&local_138->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&local_138->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&local_138->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&local_138->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&local_138->optionalValue + 0x38) = 0;
  return local_138;
}

Assistant:

pstd::optional<ShapeSample> BilinearPatch::Sample(Point2f u) const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Sample bilinear patch parametric $(u,v)$ coordinates
    Float pdf = 1;
    Point2f uv;
    if (mesh->imageDistribution)
        uv = mesh->imageDistribution->Sample(u, &pdf);
    else if (!IsRectangle()) {
        // Sample patch $(u,v)$ with approximate uniform area sampling
        // Initialize _w_ array with differential area at bilinear patch corners
        pstd::array<Float, 4> w = {
            Length(Cross(p10 - p00, p01 - p00)), Length(Cross(p10 - p00, p11 - p10)),
            Length(Cross(p01 - p00, p11 - p01)), Length(Cross(p11 - p10, p11 - p01))};

        uv = SampleBilinear(u, w);
        pdf = BilinearPDF(uv, w);

    } else
        uv = u;

    // Compute position, $\dpdu$, and $\dpdv$ for sampled bilinear patch $(u,v)$
    Point3f pu0 = Lerp(uv[1], p00, p01), pu1 = Lerp(uv[1], p10, p11);
    Point3f p = Lerp(uv[0], pu0, pu1);
    Vector3f dpdu = pu1 - pu0;
    Vector3f dpdv = Lerp(uv[0], p01, p11) - Lerp(uv[0], p00, p10);
    if (LengthSquared(dpdu) == 0 || LengthSquared(dpdv) == 0)
        return {};

    // Compute surface normal for sampled bilinear patch $(u,v)$
    Normal3f n = Normal3f(Normalize(Cross(dpdu, dpdv)));
    if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
        n = -n;

    // Compute _pError_ for sampled bilinear patch $(u,v)$
    Vector3f pError =
        gamma(4) * Vector3f(Max(Max(Abs(p00), Abs(p10)), Max(Abs(p01), Abs(p11))));

    // Return _ShapeSample_ for sampled bilinear patch point
    return ShapeSample{Interaction(Point3fi(p, pError), n, uv),
                       pdf / Length(Cross(dpdu, dpdv))};
}